

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::GreaterEqualLayerParams::_InternalSerialize
          (GreaterEqualLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  float fVar1;
  ulong uVar2;
  void *data;
  uint8_t *puVar3;
  undefined8 *puVar4;
  size_t __n;
  
  if (this->alpha_ != 0.0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    fVar1 = this->alpha_;
    *target = '\x15';
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    data = *(void **)((uVar2 & 0xfffffffffffffffc) + 8);
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar2 & 1) == 0) {
      puVar4 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar4 = (undefined8 *)((uVar2 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar4[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar4[1],target);
      return puVar3;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* GreaterEqualLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.GreaterEqualLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // float alpha = 2;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_alpha = this->_internal_alpha();
  uint32_t raw_alpha;
  memcpy(&raw_alpha, &tmp_alpha, sizeof(tmp_alpha));
  if (raw_alpha != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_alpha(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.GreaterEqualLayerParams)
  return target;
}